

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O2

void __thiscall PolicyPureVector::PolicyPureVector(PolicyPureVector *this,PolicyPureVector *o)

{
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  PolicyDiscretePure::PolicyDiscretePure
            (&this->super_PolicyDiscretePure,&o->super_PolicyDiscretePure);
  (this->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy._vptr_Policy =
       (_func_int **)&PTR__PolicyPureVector_005e59a0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&(this->super_PolicyDiscretePure).super_PolicyDiscrete.field_0x34 =
       *(undefined4 *)&(o->super_PolicyDiscretePure).super_PolicyDiscrete.field_0x34;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,
             &o->_m_domainToActionIndices);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->_m_domainToActionIndices,&local_30);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

PolicyPureVector::PolicyPureVector(const PolicyPureVector& o) :
    PolicyDiscretePure(o)
{
    if(DEBUG_PPV)    cout << " clone PolicyPureVector ";
    _m_agentI = o._m_agentI;
    _m_domainToActionIndices =vector<Index>(o._m_domainToActionIndices);
}